

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O1

int __thiscall
QStatusBar::insertPermanentWidget(QStatusBar *this,int index,QWidget *widget,int stretch)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  SBItem local_38;
  long local_28;
  ulong uVar4;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    index = -1;
  }
  else {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    local_38.category = Permanent;
    local_38.stretch = stretch;
    uVar4 = *(ulong *)(lVar1 + 0x268);
    uVar6 = (int)uVar4 - 1;
    uVar7 = uVar4;
    uVar5 = 0xffffffff;
    if ((int)uVar6 < -1) {
      uVar5 = uVar6;
    }
    do {
      uVar7 = uVar7 - 1;
      uVar3 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar3;
      uVar6 = uVar5;
      if ((int)uVar3 < 0) break;
      uVar6 = uVar3;
    } while (*(int *)(*(long *)(lVar1 + 0x260) + 0xc + (ulong)((uint)uVar7 & 0x7fffffff) * 0x10) ==
             1);
    local_38.widget = widget;
    if (((index < 0) || (*(ulong *)(lVar1 + 0x268) < (ulong)(uint)index)) ||
       (index <= (int)uVar6 && -1 < (int)uVar6)) {
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_40 = "default";
      QMessageLogger::warning
                (local_58,
                 "QStatusBar::insertPermanentWidget: Index out of range (%d), appending widget",
                 (ulong)(uint)index);
      index = *(int *)(lVar1 + 0x268);
    }
    QtPrivate::QMovableArrayOps<QStatusBarPrivate::SBItem>::
    emplace<QStatusBarPrivate::SBItem_const&>
              ((QMovableArrayOps<QStatusBarPrivate::SBItem> *)(lVar1 + 600),(long)index,&local_38);
    QList<QStatusBarPrivate::SBItem>::begin((QList<QStatusBarPrivate::SBItem> *)(lVar1 + 600));
    reformat(this);
    bVar2 = QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&widget->field_0x8);
    if (!bVar2) {
      QWidget::show(widget);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return index;
}

Assistant:

int QStatusBar::insertPermanentWidget(int index, QWidget *widget, int stretch)
{
    if (!widget)
        return -1;

    Q_D(QStatusBar);
    QStatusBarPrivate::SBItem item{widget, stretch, QStatusBarPrivate::Permanent};

    int idx = d->indexToLastNonPermanentWidget();
    if (Q_UNLIKELY(index < 0 || index > d->items.size() || (idx >= 0 && index <= idx))) {
        qWarning("QStatusBar::insertPermanentWidget: Index out of range (%d), appending widget", index);
        index = d->items.size();
    }
    d->items.insert(index, item);

    reformat();
    if (!QWidgetPrivate::get(widget)->isExplicitlyHidden())
        widget->show();

    return index;
}